

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack15_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  uVar1 = *in;
  auVar6 = vpmovsxbd_avx(ZEXT416(0x1000004));
  *out = uVar1 & 0x7fff;
  uVar3 = *(ulong *)(in + 1);
  out[1] = uVar1 >> 0xf & 0x7fff;
  uVar2 = in[3];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar3;
  auVar7 = vpsllvd_avx2(auVar8,_DAT_00193cd0);
  auVar5._8_4_ = 0x7ffc;
  auVar5._0_8_ = 0x7ff000007ffc;
  auVar5._12_4_ = 0x7ff0;
  auVar5 = vpandq_avx512vl(auVar7,auVar5);
  auVar6 = vpermi2d_avx512vl(auVar6,auVar8,ZEXT416(uVar1));
  auVar7 = vpsrlvd_avx2(auVar6,_DAT_0019d880);
  auVar6 = vpmovzxdq_avx(auVar5);
  auVar6 = vpor_avx(auVar7,auVar6);
  auVar4._8_4_ = 0x7fff;
  auVar4._0_8_ = 0x7fff00007fff;
  auVar4._12_4_ = 0x7fff;
  auVar7 = vpandd_avx512vl(auVar7,auVar4);
  auVar6 = vpblendd_avx2(auVar6,auVar7,10);
  *(undefined1 (*) [16])(out + 2) = auVar6;
  out[6] = (uint)(uVar3 >> 0x3a) | (uVar2 & 0x1ff) << 6;
  out[7] = uVar2 >> 9 & 0x7fff;
  return in + 4;
}

Assistant:

const uint32_t *__fastunpack15_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 15);
  out++;
  *out = ((*in) >> 15) % (1U << 15);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 13)) << (15 - 13);
  out++;
  *out = ((*in) >> 13) % (1U << 15);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 11)) << (15 - 11);
  out++;
  *out = ((*in) >> 11) % (1U << 15);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 9)) << (15 - 9);
  out++;
  *out = ((*in) >> 9) % (1U << 15);
  out++;

  return in + 1;
}